

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<const_char_*const>::dispose(ArrayBuilder<const_char_*const> *this)

{
  char **ppcVar1;
  RemoveConst<const_char_*const> *ppcVar2;
  char **ppcVar3;
  
  ppcVar1 = this->ptr;
  if (ppcVar1 != (char **)0x0) {
    ppcVar2 = this->pos;
    ppcVar3 = this->endPtr;
    this->endPtr = (char **)0x0;
    this->ptr = (char **)0x0;
    this->pos = (RemoveConst<const_char_*const> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,ppcVar1,8,(long)ppcVar2 - (long)ppcVar1 >> 3,
               (long)ppcVar3 - (long)ppcVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }